

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O1

void __thiscall Imf_3_2::InputFile::initialize(InputFile *this)

{
  InputPartData *pIVar1;
  size_t sVar2;
  Data *pDVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  ScanLineInputFile *this_00;
  DeepScanLineInputFile *pDVar7;
  CompositeDeepScanLine *this_01;
  LineOrder *pLVar8;
  Box2i *pBVar9;
  TiledInputFile *this_02;
  ArgExc *pAVar10;
  stringstream _iex_throw_s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  pIVar1 = this->_data->part;
  bVar4 = Header::hasType(&this->_data->header);
  if (pIVar1 == (InputPartData *)0x0) {
    if (bVar4) {
      psVar6 = Header::type_abi_cxx11_(&this->_data->header);
      sVar2 = psVar6->_M_string_length;
      if ((sVar2 == DAT_003dbc28) &&
         ((sVar2 == 0 ||
          (iVar5 = bcmp((psVar6->_M_dataplus)._M_p,DEEPSCANLINE_abi_cxx11_,sVar2), iVar5 == 0)))) {
        pDVar3 = this->_data;
        pDVar3->isTiled = false;
        pBVar9 = Header::dataWindow(&pDVar3->header);
        pDVar3 = this->_data;
        pDVar3->minY = (pBVar9->min).y;
        pDVar3->maxY = (pBVar9->max).y;
        pDVar7 = (DeepScanLineInputFile *)operator_new(0x10);
        DeepScanLineInputFile::DeepScanLineInputFile
                  (pDVar7,&pDVar3->header,pDVar3->_streamData->is,pDVar3->version,pDVar3->numThreads
                  );
        this->_data->dsFile = pDVar7;
        this_01 = (CompositeDeepScanLine *)operator_new(0x10);
        CompositeDeepScanLine::CompositeDeepScanLine(this_01);
        goto LAB_00192cd5;
      }
    }
    pDVar3 = this->_data;
    if ((pDVar3->version & 0xa00U) == 0x200) {
      pDVar3->isTiled = true;
      pLVar8 = Header::lineOrder(&pDVar3->header);
      pDVar3 = this->_data;
      pDVar3->lineOrder = *pLVar8;
      pBVar9 = Header::dataWindow(&pDVar3->header);
      pDVar3 = this->_data;
      pDVar3->minY = (pBVar9->min).y;
      pDVar3->maxY = (pBVar9->max).y;
      this_02 = (TiledInputFile *)operator_new(0x10);
      TiledInputFile::TiledInputFile
                (this_02,&pDVar3->header,pDVar3->_streamData->is,pDVar3->version,pDVar3->numThreads)
      ;
LAB_00192c4b:
      this->_data->tFile = this_02;
      return;
    }
    bVar4 = Header::hasType(&pDVar3->header);
    if (bVar4) {
      psVar6 = Header::type_abi_cxx11_(&this->_data->header);
      sVar2 = psVar6->_M_string_length;
      if ((sVar2 != DAT_003dbbe8) ||
         ((sVar2 != 0 &&
          (iVar5 = bcmp((psVar6->_M_dataplus)._M_p,SCANLINEIMAGE_abi_cxx11_,sVar2), iVar5 != 0)))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,"InputFile cannot handle parts of type ",0x26);
        psVar6 = Header::type_abi_cxx11_(&this->_data->header);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
        pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar10,local_1a0);
        __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
    this_00 = (ScanLineInputFile *)operator_new(0x18);
    pDVar3 = this->_data;
    ScanLineInputFile::ScanLineInputFile
              (this_00,&pDVar3->header,pDVar3->_streamData->is,pDVar3->numThreads);
  }
  else {
    if (bVar4) {
      psVar6 = Header::type_abi_cxx11_(&this->_data->header);
      sVar2 = psVar6->_M_string_length;
      if ((sVar2 == DAT_003dbc28) &&
         ((sVar2 == 0 ||
          (iVar5 = bcmp((psVar6->_M_dataplus)._M_p,DEEPSCANLINE_abi_cxx11_,sVar2), iVar5 == 0)))) {
        pDVar3 = this->_data;
        pDVar3->isTiled = false;
        pBVar9 = Header::dataWindow(&pDVar3->header);
        pDVar3 = this->_data;
        pDVar3->minY = (pBVar9->min).y;
        pDVar3->maxY = (pBVar9->max).y;
        pDVar7 = (DeepScanLineInputFile *)operator_new(0x10);
        DeepScanLineInputFile::DeepScanLineInputFile(pDVar7,pDVar3->part);
        this->_data->dsFile = pDVar7;
        this_01 = (CompositeDeepScanLine *)operator_new(0x10);
        CompositeDeepScanLine::CompositeDeepScanLine(this_01);
LAB_00192cd5:
        pDVar3 = this->_data;
        pDVar3->compositor = this_01;
        CompositeDeepScanLine::addSource(this_01,pDVar3->dsFile);
        return;
      }
    }
    bVar4 = Header::hasType(&this->_data->header);
    if (bVar4) {
      psVar6 = Header::type_abi_cxx11_(&this->_data->header);
      sVar2 = psVar6->_M_string_length;
      if ((sVar2 == _DAT_003dbc08) &&
         ((sVar2 == 0 ||
          (iVar5 = bcmp((psVar6->_M_dataplus)._M_p,TILEDIMAGE_abi_cxx11_,sVar2), iVar5 == 0)))) {
        pDVar3 = this->_data;
        pDVar3->isTiled = true;
        pLVar8 = Header::lineOrder(&pDVar3->header);
        pDVar3 = this->_data;
        pDVar3->lineOrder = *pLVar8;
        pBVar9 = Header::dataWindow(&pDVar3->header);
        pDVar3 = this->_data;
        pDVar3->minY = (pBVar9->min).y;
        pDVar3->maxY = (pBVar9->max).y;
        this_02 = (TiledInputFile *)operator_new(0x10);
        TiledInputFile::TiledInputFile(this_02,pDVar3->part);
        goto LAB_00192c4b;
      }
    }
    bVar4 = Header::hasType(&this->_data->header);
    if (bVar4) {
      psVar6 = Header::type_abi_cxx11_(&this->_data->header);
      sVar2 = psVar6->_M_string_length;
      if ((sVar2 != DAT_003dbbe8) ||
         ((sVar2 != 0 &&
          (iVar5 = bcmp((psVar6->_M_dataplus)._M_p,SCANLINEIMAGE_abi_cxx11_,sVar2), iVar5 != 0)))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,"InputFile cannot handle parts of type ",0x26);
        psVar6 = Header::type_abi_cxx11_(&this->_data->header);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
        pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar10,local_1a0);
        __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
    this_00 = (ScanLineInputFile *)operator_new(0x18);
    ScanLineInputFile::ScanLineInputFile(this_00,this->_data->part);
  }
  this->_data->sFile = this_00;
  return;
}

Assistant:

void
InputFile::initialize ()
{
    if (!_data->part)
    {
        if (_data->header.hasType () && _data->header.type () == DEEPSCANLINE)
        {
            _data->isTiled          = false;
            const Box2i& dataWindow = _data->header.dataWindow ();
            _data->minY             = dataWindow.min.y;
            _data->maxY             = dataWindow.max.y;

            _data->dsFile = new DeepScanLineInputFile (
                _data->header,
                _data->_streamData->is,
                _data->version,
                _data->numThreads);
            _data->compositor = new CompositeDeepScanLine;
            _data->compositor->addSource (_data->dsFile);
        }

        else if (isTiled (_data->version) && !isNonImage (_data->version))
        {
            _data->isTiled   = true;
            _data->lineOrder = _data->header.lineOrder ();

            //
            // Save the dataWindow information
            //

            const Box2i& dataWindow = _data->header.dataWindow ();
            _data->minY             = dataWindow.min.y;
            _data->maxY             = dataWindow.max.y;

            _data->tFile = new TiledInputFile (
                _data->header,
                _data->_streamData->is,
                _data->version,
                _data->numThreads);
        }

        else if (
            !_data->header.hasType () || _data->header.type () == SCANLINEIMAGE)
        {
            _data->sFile = new ScanLineInputFile (
                _data->header, _data->_streamData->is, _data->numThreads);
        }
        else
        {
            // type set but not recognised

            THROW (
                IEX_NAMESPACE::ArgExc,
                "InputFile cannot handle parts of type "
                    << _data->header.type ());
        }
    }
    else
    {
        if (_data->header.hasType () && _data->header.type () == DEEPSCANLINE)
        {
            _data->isTiled          = false;
            const Box2i& dataWindow = _data->header.dataWindow ();
            _data->minY             = dataWindow.min.y;
            _data->maxY             = dataWindow.max.y;

            _data->dsFile     = new DeepScanLineInputFile (_data->part);
            _data->compositor = new CompositeDeepScanLine;
            _data->compositor->addSource (_data->dsFile);
        }
        else if (
            _data->header.hasType () && _data->header.type () == TILEDIMAGE)
        {
            _data->isTiled   = true;
            _data->lineOrder = _data->header.lineOrder ();

            //
            // Save the dataWindow information
            //

            const Box2i& dataWindow = _data->header.dataWindow ();
            _data->minY             = dataWindow.min.y;
            _data->maxY             = dataWindow.max.y;

            _data->tFile = new TiledInputFile (_data->part);
        }
        else if (
            !_data->header.hasType () || _data->header.type () == SCANLINEIMAGE)
        {
            _data->sFile = new ScanLineInputFile (_data->part);
        }
        else
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "InputFile cannot handle parts of type "
                    << _data->header.type ());
        }
    }
}